

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_column_boundary.cpp
# Opt level: O1

void __thiscall
Boundary_z2_column_other<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>_>
::test_method(Boundary_z2_column_other<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>_>
              *this)

{
  Column_settings settings;
  vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
  matrix;
  Column_settings local_59;
  vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
  local_58;
  vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
  local_40;
  vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
  local_28;
  
  column_test_base_boundary_z2_methods<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>*,8ul,void,void>>>
            ();
  build_base_boundary_column_matrix<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>*,8ul,void,void>>>
            (&local_58,&local_59);
  column_test_boundary_methods<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>*,8ul,void,void>>>
            (&local_58);
  build_column_matrix<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>*,8ul,void,void>>>
            (&local_40,&local_59);
  local_28.
  super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58.
       super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_28.
  super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_58.
       super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_28.
  super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_58.
       super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_58.
  super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_40.
       super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_58.
  super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_40.
       super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58.
  super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_40.
       super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_40.
  super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_40.
  super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_40.
  super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
  ::~vector(&local_28);
  std::
  vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
  ::~vector(&local_40);
  column_test_boundary_chain_methods<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>*,8ul,void,void>>>
            (&local_58);
  std::
  vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(Boundary_z2_column_other, Column, z2_no_row_access_columns) {
  typename Column::Column_settings settings;
  column_test_base_boundary_z2_methods<Column>();

  std::vector<Column> matrix = build_base_boundary_column_matrix<Column>(settings);
  column_test_boundary_methods<Column>(matrix);

  matrix = build_column_matrix<Column>(settings);
  column_test_boundary_chain_methods<Column>(matrix);
}